

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall MapLoader::~MapLoader(MapLoader *this)

{
  MapLoader *this_local;
  
  std::__cxx11::string::~string((string *)&this->filePath);
  return;
}

Assistant:

MapLoader::~MapLoader() {

}